

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::PopFunctionBlockerBarrier(cmMakefile *this,bool reportError)

{
  pointer *ppuVar1;
  ulong uVar2;
  cmFunctionBlocker *pcVar3;
  pointer puVar4;
  cmFunctionBlocker *pcVar5;
  pointer ppcVar6;
  pointer puVar7;
  ostream *poVar8;
  pointer *__ptr;
  ostringstream e;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  puVar7 = (this->FunctionBlockers).c.
           super__Vector_base<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar2 = (this->FunctionBlockerBarriers).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  if (uVar2 < (ulong)((long)puVar7 -
                      (long)(this->FunctionBlockers).c.
                            super__Vector_base<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    do {
      pcVar3 = puVar7[-1]._M_t.
               super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
               super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl;
      puVar7[-1]._M_t.
      super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>._M_t.
      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
      super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl = (cmFunctionBlocker *)0x0;
      puVar4 = (this->FunctionBlockers).c.
               super__Vector_base<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar7 = puVar4 + -1;
      (this->FunctionBlockers).c.
      super__Vector_base<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar7;
      pcVar5 = puVar4[-1]._M_t.
               super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
               super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl;
      if (pcVar5 != (cmFunctionBlocker *)0x0) {
        (*pcVar5->_vptr_cmFunctionBlocker[1])();
      }
      (puVar7->_M_t).
      super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>._M_t.
      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
      super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl = (cmFunctionBlocker *)0x0;
      if ((reportError & 1U) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"A logical block opening on the line\n",0x24);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
        poVar8 = operator<<((ostream *)local_1a8,&pcVar3->StartingContext);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"is not closed.",0xe);
        std::__cxx11::stringbuf::str();
        ppcVar6 = (this->ExecutionStatusStack).
                  super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((this->ExecutionStatusStack).
            super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
            super__Vector_impl_data._M_start != ppcVar6) {
          ppcVar6[-1]->NestedError = true;
        }
        cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,&local_1c8,
                            &this->Backtrace);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        reportError = false;
      }
      if (pcVar3 != (cmFunctionBlocker *)0x0) {
        (*pcVar3->_vptr_cmFunctionBlocker[1])(pcVar3);
      }
      puVar7 = (this->FunctionBlockers).c.
               super__Vector_base<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar2 < (ulong)((long)puVar7 -
                             (long)(this->FunctionBlockers).c.
                                   super__Vector_base<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppuVar1 = &(this->FunctionBlockerBarriers).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  return;
}

Assistant:

void cmMakefile::PopFunctionBlockerBarrier(bool reportError)
{
  // Remove any extra entries pushed on the barrier.
  FunctionBlockersType::size_type barrier =
    this->FunctionBlockerBarriers.back();
  while (this->FunctionBlockers.size() > barrier) {
    std::unique_ptr<cmFunctionBlocker> fb(
      std::move(this->FunctionBlockers.top()));
    this->FunctionBlockers.pop();
    if (reportError) {
      // Report the context in which the unclosed block was opened.
      cmListFileContext const& lfc = fb->GetStartingContext();
      std::ostringstream e;
      /* clang-format off */
      e << "A logical block opening on the line\n"
        << "  " << lfc << "\n"
        << "is not closed.";
      /* clang-format on */
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      reportError = false;
    }
  }

  // Remove the barrier.
  this->FunctionBlockerBarriers.pop_back();
}